

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommandFactory
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,bool definition,CommandFlavourFlags flavourFlags)

{
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *params;
  _Rb_tree_header *p_Var1;
  size_type *psVar2;
  ulong uVar3;
  pointer puVar4;
  unsigned_long uVar5;
  pointer pPVar6;
  bool bVar7;
  bool singular;
  int iVar8;
  MemberData *pMVar9;
  long lVar10;
  _Base_ptr p_Var11;
  char *pcVar12;
  _Base_ptr p_Var13;
  _Alloc_hider _Var14;
  VulkanHppGenerator *pVVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  char *pcVar18;
  size_type sVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  string noexceptString;
  allocator_type local_572;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_571;
  string returnType;
  string className;
  string handleType;
  string vulkanType;
  string returnVariable;
  string commandName;
  string resultCheck;
  string definitionTemplate;
  string dataType;
  string argumentList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dataTypes;
  string returnStatements;
  string callSequence;
  string dataDeclarations;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_378;
  string strippedValue;
  size_type local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skippedParams;
  
  params = &commandData->params;
  pVVar15 = (VulkanHppGenerator *)
            &(commandData->params).
             super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
             ._M_impl.super__Vector_impl_data._M_start
             [(returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
              _M_impl.super__Vector_impl_data._M_finish[-1]].type.type;
  bVar7 = isHandleType(this,(string *)pVVar15);
  if (!bVar7) {
    p_Var13 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var13 == (_Base_ptr)0x0) {
LAB_0016b50e:
      __assert_fail("isHandleType( commandData.params[returnParams.back()].type.type ) || ( vectorParams.contains( returnParams.back() ) && vectorParams.find( returnParams.back() )->second.byStructure && isHandleType( vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type ) )"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x243f,
                    "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                   );
    }
    p_Var11 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header;
    uVar3 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_finish[-1];
    p_Var16 = p_Var11;
    p_Var17 = p_Var13;
    do {
      if (*(ulong *)(p_Var17 + 1) >= uVar3) {
        p_Var16 = p_Var17;
      }
      p_Var17 = (&p_Var17->_M_left)[*(ulong *)(p_Var17 + 1) < uVar3];
    } while (p_Var17 != (_Base_ptr)0x0);
    if ((p_Var16 == p_Var11) || (p_Var17 = p_Var11, uVar3 < *(ulong *)(p_Var16 + 1)))
    goto LAB_0016b50e;
    do {
      if (*(ulong *)(p_Var13 + 1) >= uVar3) {
        p_Var17 = p_Var13;
      }
      p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uVar3];
    } while (p_Var13 != (_Base_ptr)0x0);
    if ((p_Var17 != p_Var11) && (*(ulong *)(p_Var17 + 1) <= uVar3)) {
      p_Var11 = p_Var17;
    }
    if (*(char *)&p_Var11[1]._M_right != '\x01') goto LAB_0016b50e;
    pMVar9 = vectorMemberByStructure
                       (this,&(params->
                              super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar3].type.type);
    pVVar15 = (VulkanHppGenerator *)&(pMVar9->type).type;
    bVar7 = isHandleType(this,(string *)pVVar15);
    if (!bVar7) goto LAB_0016b50e;
  }
  puVar4 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_start;
  lVar10 = (long)(returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
  if ((lVar10 != 1) &&
     ((((lVar10 != 2 || ((vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1)) ||
       (p_Var13 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
       (_Base_ptr)*puVar4 != p_Var13[1]._M_parent)) ||
      (puVar4[1] != *(unsigned_long *)(p_Var13 + 1))))) {
    __assert_fail("( returnParams.size() == 1 ) || ( ( returnParams.size() == 2 ) && ( vectorParams.size() == 1 ) && ( returnParams[0] == vectorParams.begin()->second.lenParam ) && ( returnParams[1] == vectorParams.begin()->first ) )"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x2442,
                  "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                 );
  }
  determineVoidPointerParams
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &strippedValue,pVVar15,params);
  if (local_320 != 0) {
    __assert_fail("determineVoidPointerParams( commandData.params ).empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x2443,
                  "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                 );
  }
  pVVar15 = (VulkanHppGenerator *)&strippedValue;
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)pVVar15);
  bVar7 = determineEnumeration(pVVar15,vectorParams,returnParams);
  singular = (bool)((flavourFlags.m_mask & 4) >> 2);
  pVVar15 = this;
  determineSkippedParams
            (&skippedParams,this,params,initialSkipCount,vectorParams,returnParams,singular);
  if ((flavourFlags.m_mask & 4) == 0) {
    local_378._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_378._M_impl.super__Rb_tree_header._M_header;
    local_378._M_impl._0_8_ = 0;
    local_378._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_378._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_378._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_378._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_378._M_impl.super__Rb_tree_header._M_header._M_right =
         local_378._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    determineSingularParams
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &local_378,pVVar15,
               (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish[-1],vectorParams);
  }
  generateRAIIHandleCommandFactoryArgumentList_abi_cxx11_
            (&argumentList,this,params,&skippedParams,definition,singular);
  generateCommandName(&commandName,this,name,params,initialSkipCount,flavourFlags);
  handleType._M_dataplus._M_p = (pointer)&handleType.field_2;
  handleType._M_string_length = 0;
  handleType.field_2._M_local_buf[0] = '\0';
  if (((vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 1) &&
     (p_Var13 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
     *(char *)&p_Var13[1]._M_right == '\x01')) {
    if (*(unsigned_long *)(p_Var13 + 1) !=
        (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish[-1]) {
      __assert_fail("vectorParams.begin()->first == returnParams.back()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x244f,
                    "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                   );
    }
    pMVar9 = vectorMemberByStructure
                       (this,&(commandData->params).
                              super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].type.type);
    noexceptString._M_dataplus._M_p = (pointer)&noexceptString.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&noexceptString,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE","");
    returnType._M_dataplus._M_p = (pointer)&returnType.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&returnType,"Vk","");
    TypeInfo::compose(&strippedValue,&pMVar9->type,&noexceptString,&returnType);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&handleType,&strippedValue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)strippedValue._M_dataplus._M_p != &strippedValue.field_2) {
      operator_delete(strippedValue._M_dataplus._M_p,strippedValue.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)returnType._M_dataplus._M_p != &returnType.field_2) {
      operator_delete(returnType._M_dataplus._M_p,returnType.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)noexceptString._M_dataplus._M_p != &noexceptString.field_2) {
      operator_delete(noexceptString._M_dataplus._M_p,
                      noexceptString.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    uVar5 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_finish[-1];
    pPVar6 = (params->
             super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
             )._M_impl.super__Vector_impl_data._M_start;
    noexceptString._M_dataplus._M_p = (pointer)&noexceptString.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&noexceptString,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE","");
    returnType._M_dataplus._M_p = (pointer)&returnType.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&returnType,"Vk","");
    TypeInfo::compose(&strippedValue,&pPVar6[uVar5].type,&noexceptString,&returnType);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&handleType,&strippedValue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)strippedValue._M_dataplus._M_p != &strippedValue.field_2) {
      operator_delete(strippedValue._M_dataplus._M_p,strippedValue.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)returnType._M_dataplus._M_p != &returnType.field_2) {
      operator_delete(returnType._M_dataplus._M_p,returnType.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)noexceptString._M_dataplus._M_p != &noexceptString.field_2) {
      operator_delete(noexceptString._M_dataplus._M_p,
                      noexceptString.field_2._M_allocated_capacity + 1);
    }
  }
  paVar20 = &noexceptString.field_2;
  noexceptString._M_dataplus._M_p = (pointer)paVar20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&noexceptString," *","");
  strippedValue._M_dataplus._M_p = (pointer)&strippedValue.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&strippedValue,handleType._M_dataplus._M_p,
             handleType._M_dataplus._M_p + handleType._M_string_length);
  _Var14._M_p = strippedValue._M_dataplus._M_p;
  sVar19 = strippedValue._M_string_length - noexceptString._M_string_length;
  if ((noexceptString._M_string_length <= strippedValue._M_string_length) &&
     ((noexceptString._M_string_length == 0 ||
      (iVar8 = bcmp(strippedValue._M_dataplus._M_p +
                    (strippedValue._M_string_length - noexceptString._M_string_length),
                    noexceptString._M_dataplus._M_p,noexceptString._M_string_length), iVar8 == 0))))
  {
    _Var14._M_p[sVar19] = '\0';
    strippedValue._M_string_length = sVar19;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&handleType,&strippedValue);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strippedValue._M_dataplus._M_p != &strippedValue.field_2) {
    operator_delete(strippedValue._M_dataplus._M_p,strippedValue.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)noexceptString._M_dataplus._M_p != paVar20) {
    operator_delete(noexceptString._M_dataplus._M_p,noexceptString.field_2._M_allocated_capacity + 1
                   );
  }
  pcVar18 = "VULKAN_HPP_RAII_CREATE_NOEXCEPT";
  if (bVar7) {
    pcVar18 = "";
  }
  pcVar12 = pcVar18 + 0x1f;
  if (bVar7) {
    pcVar12 = pcVar18;
  }
  noexceptString._M_dataplus._M_p = (pointer)paVar20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&noexceptString,pcVar18,pcVar12);
  returnType._M_dataplus._M_p = (pointer)&returnType.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&returnType,handleType._M_dataplus._M_p,
             handleType._M_dataplus._M_p + handleType._M_string_length);
  p_Var13 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header;
  if (p_Var13 != (_Base_ptr)0x0) {
    uVar3 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_finish[-1];
    p_Var11 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var13 + 1) >= uVar3) {
        p_Var11 = p_Var13;
      }
      p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uVar3];
    } while (p_Var13 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var11 != p_Var1) && ((flavourFlags.m_mask & 4) == 0)) &&
       (*(ulong *)(p_Var11 + 1) <= uVar3)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&noexceptString,0,noexceptString._M_string_length,"",0);
      std::operator+(&className,"std::vector<",&handleType);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&className,">");
      generateRAIIHandleCommandFactory();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&handleType,"s");
    }
  }
  if (definition) {
    if (initialSkipCount == 0) {
      className._M_dataplus._M_p = (pointer)&className.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&className,"Context","");
    }
    else {
      pPVar6 = (params->
               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               )._M_impl.super__Vector_impl_data._M_start;
      strippedValue._M_dataplus._M_p = (pointer)&strippedValue.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&strippedValue,"Vk","");
      className._M_dataplus._M_p = (pointer)&className.field_2;
      _Var14._M_p = pPVar6[initialSkipCount - 1].type.type._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&className,_Var14._M_p,
                 _Var14._M_p + pPVar6[initialSkipCount - 1].type.type._M_string_length);
      sVar19 = strippedValue._M_string_length;
      _Var14 = strippedValue._M_dataplus;
      if ((strippedValue._M_string_length <= className._M_string_length) &&
         ((strippedValue._M_string_length == 0 ||
          (iVar8 = bcmp(className._M_dataplus._M_p,strippedValue._M_dataplus._M_p,
                        strippedValue._M_string_length), iVar8 == 0)))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&className,0,sVar19);
        _Var14 = strippedValue._M_dataplus;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var14._M_p != &strippedValue.field_2) {
        operator_delete(_Var14._M_p,strippedValue.field_2._M_allocated_capacity + 1);
      }
    }
    psVar2 = &strippedValue._M_string_length;
    strippedValue.field_2._M_allocated_capacity = 0;
    strippedValue._M_dataplus._M_p = (pointer)0x0;
    strippedValue._M_string_length = 0;
    pVVar15 = this;
    strippedValue.field_2._8_8_ = psVar2;
    determineDataTypes_abi_cxx11_
              (&dataTypes,this,params,vectorParams,returnParams,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &strippedValue);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&strippedValue);
    combineDataTypes(&dataType,pVVar15,vectorParams,returnParams,bVar7,&dataTypes,flavourFlags,true)
    ;
    generateReturnVariable_abi_cxx11_
              (&returnVariable,this,commandData,returnParams,vectorParams,flavourFlags);
    vulkanType._M_dataplus._M_p = (pointer)&vulkanType.field_2;
    vulkanType._M_string_length = 0;
    vulkanType.field_2._M_local_buf[0] = '\0';
    p_Var13 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    uVar3 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_finish[-1];
    p_Var11 = &p_Var1->_M_header;
    if (p_Var13 == (_Base_ptr)0x0) {
LAB_0016afd4:
      pPVar6 = (params->
               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar3;
    }
    else {
      do {
        if (*(ulong *)(p_Var13 + 1) >= uVar3) {
          p_Var11 = p_Var13;
        }
        p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uVar3];
      } while (p_Var13 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var11 == p_Var1) ||
          (uVar3 < ((_Rb_tree_header *)p_Var11)->_M_node_count)) ||
         (((undefined1 *)((long)p_Var11 + 0x28))[0x10] != '\x01')) goto LAB_0016afd4;
      pMVar9 = vectorMemberByStructure
                         (this,&(params->
                                super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar3].type.type);
      pPVar6 = (pointer)&pMVar9->type;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&vulkanType,&(pPVar6->type).type);
    strippedValue.field_2._M_allocated_capacity = 0;
    strippedValue._M_dataplus._M_p = (pointer)0x0;
    strippedValue._M_string_length = 0;
    strippedValue.field_2._8_8_ = psVar2;
    generateDataDeclarations
              (&dataDeclarations,this,commandData,returnParams,vectorParams,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &strippedValue,flavourFlags,true,&dataTypes,&dataType,&returnType,&returnVariable);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&strippedValue);
    strippedValue.field_2._M_allocated_capacity = 0;
    strippedValue._M_dataplus._M_p = (pointer)0x0;
    strippedValue._M_string_length = 0;
    resultCheck.field_2._M_allocated_capacity = 0;
    resultCheck._M_dataplus._M_p = (pointer)0x0;
    resultCheck._M_string_length = 0;
    strippedValue.field_2._8_8_ = psVar2;
    generateCallSequence
              (&callSequence,this,name,commandData,returnParams,vectorParams,initialSkipCount,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &local_378,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &strippedValue,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&resultCheck,
               flavourFlags,true,true);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&strippedValue);
    generateResultCheckExpected
              (&resultCheck,this,&commandData->successCodes,&className,&commandName);
    generateRAIIFactoryReturnStatements
              (&returnStatements,this,params,&commandData->successCodes,&vulkanType,bVar7,
               &returnType,&returnVariable,singular);
    definitionTemplate._M_dataplus._M_p = (pointer)&definitionTemplate.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&definitionTemplate,
               "\n  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n  VULKAN_HPP_NODISCARD VULKAN_HPP_INLINE VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${className}::${commandName}( ${argumentList} ) const ${noexcept}\n  {\n    ${dataDeclarations}\n    ${callSequence}\n    ${resultCheck}\n    ${returnStatements}\n  }\n"
               ,"");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&strippedValue,(char (*) [13])"argumentList",&argumentList);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_308,(char (*) [13])"callSequence",&callSequence);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_2c8,(char (*) [10])"className",&className);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_288,(char (*) [12])"commandName",&commandName);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_248,(char (*) [17])"dataDeclarations",&dataDeclarations);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_208,(char (*) [9])"noexcept",&noexceptString);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_1c8,(char (*) [12])"resultCheck",&resultCheck);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_188,(char (*) [17])"returnStatements",&returnStatements);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_148,(char (*) [11])"returnType",&returnType);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[14],_true>(&local_108,(char (*) [14])"vkCommandName",name);
    __l_00._M_len = 10;
    __l_00._M_array = (iterator)&strippedValue;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_90,__l_00,&local_571,&local_572);
    replaceWithMap(__return_storage_ptr__,&definitionTemplate,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_90);
    lVar10 = -0x280;
    paVar20 = &local_108.second.field_2;
    do {
      if (paVar20 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar20->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar20->_M_allocated_capacity)[-2],
                        paVar20->_M_allocated_capacity + 1);
      }
      if (&paVar20->_M_allocated_capacity + -4 != (size_type *)(&paVar20->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar20->_M_allocated_capacity)[-6],
                        (&paVar20->_M_allocated_capacity)[-4] + 1);
      }
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar20->_M_allocated_capacity + -8);
      lVar10 = lVar10 + 0x40;
    } while (lVar10 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)definitionTemplate._M_dataplus._M_p != &definitionTemplate.field_2) {
      operator_delete(definitionTemplate._M_dataplus._M_p,
                      definitionTemplate.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)returnStatements._M_dataplus._M_p != &returnStatements.field_2) {
      operator_delete(returnStatements._M_dataplus._M_p,
                      returnStatements.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)resultCheck._M_dataplus._M_p != &resultCheck.field_2) {
      operator_delete(resultCheck._M_dataplus._M_p,resultCheck.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)callSequence._M_dataplus._M_p != &callSequence.field_2) {
      operator_delete(callSequence._M_dataplus._M_p,callSequence.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dataDeclarations._M_dataplus._M_p != &dataDeclarations.field_2) {
      operator_delete(dataDeclarations._M_dataplus._M_p,
                      dataDeclarations.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vulkanType._M_dataplus._M_p != &vulkanType.field_2) {
      operator_delete(vulkanType._M_dataplus._M_p,
                      CONCAT71(vulkanType.field_2._M_allocated_capacity._1_7_,
                               vulkanType.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)returnVariable._M_dataplus._M_p != &returnVariable.field_2) {
      operator_delete(returnVariable._M_dataplus._M_p,
                      returnVariable.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dataType._M_dataplus._M_p != &dataType.field_2) {
      operator_delete(dataType._M_dataplus._M_p,dataType.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dataTypes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)className._M_dataplus._M_p == &className.field_2) goto LAB_0016adb5;
  }
  else {
    className._M_dataplus._M_p = (pointer)&className.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&className,
               "\n  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n  VULKAN_HPP_NODISCARD VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${commandName}( ${argumentList} ) const ${noexcept};\n"
               ,"");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&strippedValue,(char (*) [13])"argumentList",&argumentList);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_308,(char (*) [12])"commandName",&commandName);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_2c8,(char (*) [9])"noexcept",&noexceptString);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_288,(char (*) [11])"returnType",&returnType);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[14],_true>(&local_248,(char (*) [14])"vkCommandName",name);
    __l._M_len = 5;
    __l._M_array = (iterator)&strippedValue;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_c0,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &dataType,(allocator_type *)&returnVariable);
    replaceWithMap(__return_storage_ptr__,&className,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_c0);
    lVar10 = -0x140;
    paVar20 = &local_248.second.field_2;
    do {
      if (paVar20 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar20->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar20->_M_allocated_capacity)[-2],
                        paVar20->_M_allocated_capacity + 1);
      }
      if (&paVar20->_M_allocated_capacity + -4 != (size_type *)(&paVar20->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar20->_M_allocated_capacity)[-6],
                        (&paVar20->_M_allocated_capacity)[-4] + 1);
      }
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar20->_M_allocated_capacity + -8);
      lVar10 = lVar10 + 0x40;
    } while (lVar10 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)className._M_dataplus._M_p == &className.field_2) goto LAB_0016adb5;
  }
  operator_delete(className._M_dataplus._M_p,className.field_2._M_allocated_capacity + 1);
LAB_0016adb5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)returnType._M_dataplus._M_p != &returnType.field_2) {
    operator_delete(returnType._M_dataplus._M_p,returnType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)noexceptString._M_dataplus._M_p != &noexceptString.field_2) {
    operator_delete(noexceptString._M_dataplus._M_p,noexceptString.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)handleType._M_dataplus._M_p != &handleType.field_2) {
    operator_delete(handleType._M_dataplus._M_p,
                    CONCAT71(handleType.field_2._M_allocated_capacity._1_7_,
                             handleType.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)commandName._M_dataplus._M_p != &commandName.field_2) {
    operator_delete(commandName._M_dataplus._M_p,commandName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argumentList._M_dataplus._M_p != &argumentList.field_2) {
    operator_delete(argumentList._M_dataplus._M_p,argumentList.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_378);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&skippedParams._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommandFactory( std::string const &                       name,
                                                                  CommandData const &                       commandData,
                                                                  size_t                                    initialSkipCount,
                                                                  std::vector<size_t> const &               returnParams,
                                                                  std::map<size_t, VectorParamData> const & vectorParams,
                                                                  bool                                      definition,
                                                                  CommandFlavourFlags                       flavourFlags ) const
{
  assert( isHandleType( commandData.params[returnParams.back()].type.type ) ||
          ( vectorParams.contains( returnParams.back() ) && vectorParams.find( returnParams.back() )->second.byStructure &&
            isHandleType( vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type ) ) );
  assert( ( returnParams.size() == 1 ) ||
          ( ( returnParams.size() == 2 ) && ( vectorParams.size() == 1 ) && ( returnParams[0] == vectorParams.begin()->second.lenParam ) &&
            ( returnParams[1] == vectorParams.begin()->first ) ) );
  assert( determineVoidPointerParams( commandData.params ).empty() );

  const bool       enumerating    = determineEnumeration( vectorParams, returnParams );
  const bool       singular       = flavourFlags & CommandFlavourFlagBits::singular;
  std::set<size_t> skippedParams  = determineSkippedParams( commandData.params, initialSkipCount, vectorParams, returnParams, singular );
  std::set<size_t> singularParams = singular ? determineSingularParams( returnParams.back(), vectorParams ) : std::set<size_t>();
  std::string      argumentList   = generateRAIIHandleCommandFactoryArgumentList( commandData.params, skippedParams, definition, singular );
  std::string      commandName    = generateCommandName( name, commandData.params, initialSkipCount, flavourFlags );

  std::string handleType;
  if ( ( vectorParams.size() == 1 ) && vectorParams.begin()->second.byStructure )
  {
    assert( vectorParams.begin()->first == returnParams.back() );
    handleType = vectorMemberByStructure( commandData.params.back().type.type ).type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE" );
  }
  else
  {
    handleType = commandData.params[returnParams.back()].type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE" );
  }
  handleType                 = stripPostfix( handleType, " *" );
  std::string noexceptString = enumerating ? "" : "VULKAN_HPP_RAII_CREATE_NOEXCEPT";
  std::string returnType     = handleType;
  if ( vectorParams.contains( returnParams.back() ) && !singular )
  {
    noexceptString = "";
    returnType     = "std::vector<" + handleType + ">";
    handleType += "s";
  }

  if ( definition )
  {
    std::string              className      = initialSkipCount ? stripPrefix( commandData.params[initialSkipCount - 1].type.type, "Vk" ) : "Context";
    std::vector<std::string> dataTypes      = determineDataTypes( commandData.params, vectorParams, returnParams, {} );
    std::string              dataType       = combineDataTypes( vectorParams, returnParams, enumerating, dataTypes, flavourFlags, true );
    std::string              returnVariable = generateReturnVariable( commandData, returnParams, vectorParams, flavourFlags );
    std::string              vulkanType;
    auto                     vectorParamIt = vectorParams.find( returnParams.back() );
    if ( ( vectorParamIt != vectorParams.end() ) && vectorParamIt->second.byStructure )
    {
      vulkanType = vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type;
    }
    else
    {
      vulkanType = commandData.params[returnParams.back()].type.type;
    }

    std::string dataDeclarations =
      generateDataDeclarations( commandData, returnParams, vectorParams, {}, flavourFlags, true, dataTypes, dataType, returnType, returnVariable );
    std::string callSequence =
      generateCallSequence( name, commandData, returnParams, vectorParams, initialSkipCount, singularParams, {}, {}, flavourFlags, true, true );
    std::string resultCheck = generateResultCheckExpected( commandData.successCodes, className, commandName );
    std::string returnStatements =
      generateRAIIFactoryReturnStatements( commandData.params, commandData.successCodes, vulkanType, enumerating, returnType, returnVariable, singular );

    std::string const definitionTemplate =
      R"(
  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
  VULKAN_HPP_NODISCARD VULKAN_HPP_INLINE VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${className}::${commandName}( ${argumentList} ) const ${noexcept}
  {
    ${dataDeclarations}
    ${callSequence}
    ${resultCheck}
    ${returnStatements}
  }
)";

    return replaceWithMap( definitionTemplate,
                           { { "argumentList", argumentList },
                             { "callSequence", callSequence },
                             { "className", className },
                             { "commandName", commandName },
                             { "dataDeclarations", dataDeclarations },
                             { "noexcept", noexceptString },
                             { "resultCheck", resultCheck },
                             { "returnStatements", returnStatements },
                             { "returnType", returnType },
                             { "vkCommandName", name } } );
  }
  else
  {
    std::string const declarationTemplate =
      R"(
  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
  VULKAN_HPP_NODISCARD VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${commandName}( ${argumentList} ) const ${noexcept};
)";

    return replaceWithMap( declarationTemplate,
                           { { "argumentList", argumentList },
                             { "commandName", commandName },
                             { "noexcept", noexceptString },
                             { "returnType", returnType },
                             { "vkCommandName", name } } );
  }
}